

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsubwins.cpp
# Opt level: O1

void init_windows(void)

{
  Am_Drawonable *pAVar1;
  Am_Style local_40 [8];
  Am_Style local_38 [8];
  Am_Style local_30 [8];
  
  pAVar1 = (Am_Drawonable *)Am_Drawonable::Get_Root_Drawonable((char *)0x0);
  root = pAVar1;
  Am_Style::Am_Style(local_30,(Am_Style *)&Am_No_Style);
  d1 = (Am_Drawonable *)
       (*(code *)**(undefined8 **)pAVar1)
                 (pAVar1,0x352,0xb4,0xdc,100,"","",1,0,local_30,0,1,1,0,0,1,0,0,1,0);
  Am_Style::~Am_Style(local_30);
  pAVar1 = d1;
  Am_Style::Am_Style(local_38,(Am_Style *)&Am_No_Style);
  d2 = (Am_Drawonable *)
       (*(code *)**(undefined8 **)pAVar1)
                 (pAVar1,0xfffffff1,0x16,0xaf,100,"D2","D2 Icon",1,0,local_38,0,1,1,0,0,1,0,0,1,0);
  Am_Style::~Am_Style(local_38);
  pAVar1 = d2;
  Am_Style::Am_Style(local_40,(Am_Style *)&Am_No_Style);
  d3 = (Am_Drawonable *)
       (*(code *)**(undefined8 **)pAVar1)
                 (pAVar1,0x1e,0x12,0x96,100,"","",1,0,local_40,0,1,1,0,0,1,0,0,1,0);
  Am_Style::~Am_Style(local_40);
  return;
}

Assistant:

void
init_windows()
{
  root = Am_Drawonable::Get_Root_Drawonable();
  d1 = root->Create(850, 180, 220, 100);
  d2 = d1->Create(-15, 22, 175, 100, "D2", "D2 Icon", true, false, Am_No_Style,
                  false, 1, 1, 0, 0,
                  // want a title-bar when placed at top-level
                  true);
  d3 = d2->Create(30, 18, 150, 100);
}